

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.h
# Opt level: O2

unsigned_long find_first_bit(unsigned_long *addr,unsigned_long size)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    if (size <= uVar3) {
      return size;
    }
    uVar2 = *addr;
    if (uVar2 != 0) break;
    addr = addr + 1;
    uVar3 = uVar3 + 0x40;
  }
  lVar1 = 0;
  if (uVar2 != 0) {
    for (; (uVar2 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
    }
  }
  uVar2 = lVar1 + uVar3;
  if (size <= lVar1 + uVar3) {
    uVar2 = size;
  }
  return uVar2;
}

Assistant:

static inline unsigned long find_first_bit(const unsigned long *addr,
                                           unsigned long size)
{
    unsigned long result, tmp;

    for (result = 0; result < size; result += BITS_PER_LONG) {
        tmp = *addr++;
        if (tmp) {
            result += ctzl(tmp);
            return result < size ? result : size;
        }
    }
    /* Not found */
    return size;
}